

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_decl.h
# Opt level: O1

uint32_t google::protobuf::internal::TcParseTableBase::RecodeTagForFastParsing(uint32_t tag)

{
  uint32_t uVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (tag < 0x4000) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)tag,0x3fff,"tag <= 0x3FFFu");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    uVar1 = tag + 0x80 + (tag & 0xffffff80);
    if ((tag & 0xffffff80) == 0) {
      uVar1 = tag;
    }
    return uVar1;
  }
  RecodeTagForFastParsing();
}

Assistant:

static uint32_t RecodeTagForFastParsing(uint32_t tag) {
    ABSL_DCHECK_LE(tag, 0x3FFFu);
    // Construct the varint-coded tag. If it is more than 7 bits, we need to
    // shift the high bits and add a continue bit.
    uint32_t hibits = tag & 0xFFFFFF80;
    if (hibits != 0) {
      // hi = tag & ~0x7F
      // lo = tag & 0x7F
      // This shifts hi to the left by 1 to the next byte and sets the
      // continuation bit.
      tag = tag + hibits + 0x80;
    }
    return tag;
  }